

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::removeMember(Value *__return_storage_ptr__,Value *this,char *key)

{
  size_t sVar1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream oss;
  char *key_local;
  Value *this_local;
  Value *removed;
  
  if (((*(ushort *)&this->field_0x8 & 0xff) != 0) && ((*(ushort *)&this->field_0x8 & 0xff) != 7)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,"in Json::Value::removeMember(): requires objectValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c8);
  }
  if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
    Value(__return_storage_ptr__,(Value *)kNull);
  }
  else {
    Value(__return_storage_ptr__,nullValue);
    sVar1 = strlen(key);
    removeMember(this,key,key + sVar1,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::removeMember(const char* key)
{
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == objectValue,
                      "in Json::Value::removeMember(): requires objectValue");
  if (type_ == nullValue)
    return nullRef;

  Value removed;  // null
  removeMember(key, key + strlen(key), &removed);
  return removed; // still null if removeMember() did nothing
}